

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

void run_test_in_the_current_process(TestSuite *suite,CgreenTest *test,TestReporter *reporter)

{
  uint32_t uVar1;
  uint32_t end_time_in_milliseconds;
  
  uVar1 = cgreen_time_get_current_milliseconds();
  (*reporter->start_test)(reporter,test->name);
  if (test->skip == 0) {
    run_the_test_code(suite,test,reporter);
    end_time_in_milliseconds = cgreen_time_get_current_milliseconds();
    uVar1 = cgreen_time_duration_in_milliseconds(uVar1,end_time_in_milliseconds);
    reporter->duration = uVar1;
    send_reporter_completion_notification(reporter);
  }
  else {
    send_reporter_skipped_notification(reporter);
  }
  (*reporter->finish_test)(reporter,test->filename,test->line,(char *)0x0);
  return;
}

Assistant:

static void run_test_in_the_current_process(TestSuite *suite, CgreenTest *test, TestReporter *reporter)
{
    uint32_t test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    (*reporter->start_test)(reporter, test->name);
    if (test->skip)
    {
        send_reporter_skipped_notification(reporter);
    }
    else
    {
        run_the_test_code(suite, test, reporter);
        reporter->duration = cgreen_time_duration_in_milliseconds(test_starting_milliseconds,
                                                                  cgreen_time_get_current_milliseconds());

        send_reporter_completion_notification(reporter);
    }
    (*reporter->finish_test)(reporter, test->filename, test->line, NULL);
}